

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O0

size_t __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::get_length(basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,error_code *ec)

{
  type tVar1;
  type_conflict5 tVar2;
  type_conflict tVar3;
  type_conflict2 tVar4;
  ulong count;
  value_type *in_RSI;
  binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_RDI;
  int64_t val_3;
  uint8_t buf_3 [8];
  int32_t val_2;
  uint8_t buf_2 [4];
  int16_t val_1;
  uint8_t buf_1 [2];
  uint8_t b;
  int8_t val;
  uint8_t buf [1];
  uint8_t type;
  size_t length;
  ubjson_errc __e;
  error_code *in_stack_ffffffffffffffc0;
  byte local_24;
  byte local_21;
  error_code *length_00;
  binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  error_code *local_8;
  
  length_00 = (error_code *)0x0;
  this_00 = in_RDI;
  tVar4 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::read<std::random_access_iterator_tag>(in_RDI,in_RSI,0);
  __e = (ubjson_errc)((ulong)in_RDI >> 0x20);
  if (tVar4 == 0) {
    std::error_code::operator=(in_stack_ffffffffffffffc0,__e);
    *(undefined1 *)&(in_RDI->end_)._M_current = 0;
    local_8 = length_00;
  }
  else {
    count = (ulong)(local_21 - 0x49);
    switch(count) {
    case 0:
      tVar4 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,in_RSI,(size_t)length_00);
      if (tVar4 == 2) {
        tVar2 = binary::big_to_native<short,jsoncons::detail::endian>((uint8_t *)in_RDI,count);
        if (tVar2 < 0) {
          std::error_code::operator=(in_stack_ffffffffffffffc0,(ubjson_errc)((ulong)in_RDI >> 0x20))
          ;
          *(undefined1 *)&(in_RDI->end_)._M_current = 0;
          local_8 = length_00;
        }
        else {
          local_8 = (error_code *)(long)tVar2;
        }
      }
      else {
        std::error_code::operator=(in_stack_ffffffffffffffc0,(ubjson_errc)((ulong)in_RDI >> 0x20));
        *(undefined1 *)&(in_RDI->end_)._M_current = 0;
        local_8 = length_00;
      }
      break;
    default:
      std::error_code::operator=(in_stack_ffffffffffffffc0,__e);
      *(undefined1 *)&(in_RDI->end_)._M_current = 0;
      local_8 = length_00;
      break;
    case 3:
      tVar4 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,in_RSI,(size_t)length_00);
      if (tVar4 == 8) {
        local_8 = (error_code *)
                  binary::big_to_native<long,jsoncons::detail::endian>((uint8_t *)in_RDI,count);
        if ((long)local_8 < 0) {
          std::error_code::operator=(local_8,(ubjson_errc)((ulong)in_RDI >> 0x20));
          *(undefined1 *)&(in_RDI->end_)._M_current = 0;
          local_8 = length_00;
        }
      }
      else {
        std::error_code::operator=(in_stack_ffffffffffffffc0,(ubjson_errc)((ulong)in_RDI >> 0x20));
        *(undefined1 *)&(in_RDI->end_)._M_current = 0;
        local_8 = length_00;
      }
      break;
    case 0xc:
      tVar4 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,in_RSI,(size_t)length_00);
      if (tVar4 == 0) {
        std::error_code::operator=(in_stack_ffffffffffffffc0,(ubjson_errc)((ulong)in_RDI >> 0x20));
        *(undefined1 *)&(in_RDI->end_)._M_current = 0;
        local_8 = length_00;
      }
      else {
        local_8 = (error_code *)(ulong)local_24;
      }
      break;
    case 0x20:
      tVar4 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,in_RSI,(size_t)length_00);
      if (tVar4 == 1) {
        tVar1 = binary::big_to_native<signed_char,jsoncons::detail::endian>((uint8_t *)in_RDI,count)
        ;
        if (tVar1 < '\0') {
          std::error_code::operator=(in_stack_ffffffffffffffc0,(ubjson_errc)((ulong)in_RDI >> 0x20))
          ;
          *(undefined1 *)&(in_RDI->end_)._M_current = 0;
          local_8 = length_00;
        }
        else {
          local_8 = (error_code *)(long)tVar1;
        }
      }
      else {
        std::error_code::operator=(in_stack_ffffffffffffffc0,(ubjson_errc)((ulong)in_RDI >> 0x20));
        *(undefined1 *)&(in_RDI->end_)._M_current = 0;
        local_8 = length_00;
      }
      break;
    case 0x23:
      tVar4 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,in_RSI,(size_t)length_00);
      if (tVar4 == 4) {
        tVar3 = binary::big_to_native<int,jsoncons::detail::endian>((uint8_t *)in_RDI,count);
        if (tVar3 < 0) {
          std::error_code::operator=(in_stack_ffffffffffffffc0,(ubjson_errc)((ulong)in_RDI >> 0x20))
          ;
          *(undefined1 *)&(in_RDI->end_)._M_current = 0;
          local_8 = length_00;
        }
        else {
          local_8 = (error_code *)(long)tVar3;
        }
      }
      else {
        std::error_code::operator=(in_stack_ffffffffffffffc0,(ubjson_errc)((ulong)in_RDI >> 0x20));
        *(undefined1 *)&(in_RDI->end_)._M_current = 0;
        local_8 = length_00;
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

std::size_t get_length(std::error_code& ec)
    {
        std::size_t length = 0;
        uint8_t type;
        if (source_.read(&type, 1) == 0)
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return length;
        }
        switch (type)
        {
            case jsoncons::ubjson::ubjson_type::int8_type: 
            {
                uint8_t buf[sizeof(int8_t)];
                if (source_.read(buf, sizeof(int8_t)) != sizeof(int8_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int8_t val = binary::big_to_native<int8_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = val;
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::uint8_type: 
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                length = b;
                break;
            }
            case jsoncons::ubjson::ubjson_type::int16_type: 
            {
                uint8_t buf[sizeof(int16_t)];
                if (source_.read(buf, sizeof(int16_t)) != sizeof(int16_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int16_t val = binary::big_to_native<int16_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = val;
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)];
                if (source_.read(buf, sizeof(int32_t)) != sizeof(int32_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int32_t val = binary::big_to_native<int32_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = static_cast<std::size_t>(val);
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)];
                if (source_.read(buf, sizeof(int64_t)) != sizeof(int64_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int64_t val = binary::big_to_native<int64_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = (std::size_t)val;
                    if (length != (uint64_t)val)
                    {
                        ec = ubjson_errc::number_too_large;
                        more_ = false;
                        return length;
                    }
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            default:
            {
                ec = ubjson_errc::length_must_be_integer;
                more_ = false;
                return length;
            }
        }
        return length;
    }